

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *message)

{
  ExtensionRange *pEVar1;
  char *pcVar2;
  long lVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  Nonnull<const_char_*> pcVar4;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar5;
  undefined8 extraout_RAX;
  long lVar6;
  ulong uVar7;
  size_t n;
  long lVar8;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  int64_t max_extension_range;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  declaration_full_name_set;
  long *local_80;
  long local_78;
  VoidPtr local_70;
  code *pcStack_68;
  VoidPtr local_60;
  code *pcStack_58;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_50;
  
  local_78 = 0x1fffffff;
  if ((message->options_->field_0)._impl_.message_set_wire_format_ != false) {
    local_78 = 0x7fffffff;
  }
  if (message->extension_range_count_ < 1) {
    n = 0;
  }
  else {
    lVar6 = 8;
    lVar8 = 0;
    n = 0;
    do {
      if (*(long *)((long)&message->extension_ranges_->start_ + lVar6) != 0) {
        if (lVar8 < message->extension_range_count_) {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (lVar8,(long)message->extension_range_count_,
                              "index < extension_range_count()");
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) {
          ValidateExtensionRangeOptions();
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~raw_hash_set(&local_50);
          _Unwind_Resume(extraout_RAX);
        }
        n = n + (long)*(int *)(*(long *)((long)&message->extension_ranges_->start_ + lVar6) + 0x38);
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar8 < message->extension_range_count_);
  }
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&local_50,n);
  if (0 < message->extension_range_count_) {
    this_00 = &(proto->field_0)._impl_.extension_range_;
    lVar6 = 8;
    lVar8 = 0;
    do {
      pEVar1 = message->extension_ranges_;
      if (local_78 + 1 < (long)*(int *)((long)pEVar1 + lVar6 + -4)) {
        pcVar2 = (message->all_names_).payload_;
        element_name._M_len = (ulong)*(ushort *)(pcVar2 + 2);
        element_name._M_str = pcVar2 + ~element_name._M_len;
        local_80 = &local_78;
        pcStack_58 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__0,std::__cxx11::string>
        ;
        local_60.obj = &local_80;
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = local_60.obj;
        AddError(this,element_name,&proto->super_Message,NUMBER,make_error);
      }
      lVar3 = *(long *)((long)&pEVar1->start_ + lVar6);
      if (*(int *)(lVar3 + 0x38) != 0) {
        if (((*(byte *)(lVar3 + 0x28) & 2) != 0) && (*(int *)(lVar3 + 0x68) == 1)) {
          pcVar2 = (message->all_names_).payload_;
          uVar7 = (ulong)*(ushort *)(pcVar2 + 2);
          pVVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                             (&this_00->super_RepeatedPtrFieldBase,(int)lVar8);
          pcStack_68 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__1,std::__cxx11::string>
          ;
          local_70.obj = &local_80;
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__1,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = local_70.obj;
          element_name_00._M_str = pcVar2 + ~uVar7;
          element_name_00._M_len = uVar7;
          AddError(this,element_name_00,&pVVar5->super_Message,EXTENDEE,make_error_00);
          break;
        }
        pcVar2 = (message->all_names_).payload_;
        uVar7 = (ulong)*(ushort *)(pcVar2 + 2);
        pVVar5 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar8);
        full_name._M_str = pcVar2 + ~uVar7;
        full_name._M_len = uVar7;
        ValidateExtensionDeclaration
                  (this,full_name,
                   (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                   (lVar3 + 0x30),pVVar5,
                   (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&local_50);
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar8 < message->extension_range_count_);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::destructor_impl(&local_50);
  return;
}

Assistant:

void DescriptorBuilder::ValidateExtensionRangeOptions(
    const DescriptorProto& proto, const Descriptor& message) {
  const int64_t max_extension_range =
      static_cast<int64_t>(message.options().message_set_wire_format()
                               ? std::numeric_limits<int32_t>::max()
                               : FieldDescriptor::kMaxNumber);

  size_t num_declarations = 0;
  for (int i = 0; i < message.extension_range_count(); i++) {
    if (message.extension_range(i)->options_ == nullptr) continue;
    num_declarations +=
        message.extension_range(i)->options_->declaration_size();
  }

  // Contains the full names from both "declaration" and "metadata".
  absl::flat_hash_set<absl::string_view> declaration_full_name_set;
  declaration_full_name_set.reserve(num_declarations);

  for (int i = 0; i < message.extension_range_count(); i++) {
    const auto& range = *message.extension_range(i);
    if (range.end_number() > max_extension_range + 1) {
      AddError(message.full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Extension numbers cannot be greater than $0.",
                     max_extension_range);
               });
    }
    const auto& range_options = *range.options_;


    if (!range_options.declaration().empty()) {
      // TODO: remove the "has_verification" check once the default
      // is flipped to DECLARATION.
      if (range_options.has_verification() &&
          range_options.verification() == ExtensionRangeOptions::UNVERIFIED) {
        AddError(message.full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                   return "Cannot mark the extension range as UNVERIFIED when "
                          "it has extension(s) declared.";
                 });
        return;
      }
      ValidateExtensionDeclaration(
          message.full_name(), range_options.declaration(),
          proto.extension_range(i), declaration_full_name_set);
    }
  }
}